

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

Descriptor *
cfd::core::Descriptor::Parse
          (Descriptor *__return_storage_ptr__,string *output_descriptor,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  network_pefixes;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_198;
  DescriptorNode local_180;
  
  local_198.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (network_parameters ==
      (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0) {
    GetBitcoinAddressFormatList();
    ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    _M_move_assign(&local_198,&local_180);
    ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            &local_180);
  }
  else {
    ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    operator=(&local_198,network_parameters);
  }
  DescriptorNode::DescriptorNode(&__return_storage_ptr__->root_node_);
  DescriptorNode::Parse(&local_180,output_descriptor,&local_198);
  DescriptorNode::operator=(&__return_storage_ptr__->root_node_,&local_180);
  DescriptorNode::~DescriptorNode(&local_180);
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
  ~vector(&local_198);
  return __return_storage_ptr__;
}

Assistant:

Descriptor Descriptor::Parse(
    const std::string& output_descriptor,
    const std::vector<AddressFormatData>* network_parameters) {
  std::vector<AddressFormatData> network_pefixes;
  if (network_parameters) {
    network_pefixes = *network_parameters;
  } else {
    network_pefixes = GetBitcoinAddressFormatList();
  }
  Descriptor desc;
  desc.root_node_ = DescriptorNode::Parse(output_descriptor, network_pefixes);
  return desc;
}